

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O2

err_t botpHOTPVerify(char *otp,octet *key,size_t key_len,octet *ctr)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t state;
  err_t eVar3;
  
  bVar1 = strIsValid(otp);
  eVar3 = 0x206;
  if (((bVar1 != 0) && (sVar2 = strLen(otp), 5 < sVar2)) && (sVar2 = strLen(otp), sVar2 < 9)) {
    bVar1 = memIsValid(key,key_len);
    eVar3 = 0x6d;
    if ((bVar1 != 0) && (bVar1 = memIsValid(ctr,8), bVar1 != 0)) {
      sVar2 = botpHOTP_keep();
      state = blobCreate(sVar2);
      if (state == (blob_t)0x0) {
        eVar3 = 0x6e;
      }
      else {
        sVar2 = strLen(otp);
        botpHOTPStart(state,sVar2,key,key_len);
        botpHOTPStepS(state,ctr);
        bVar1 = botpHOTPStepV(otp,state);
        blobClose(state);
        eVar3 = 0x206;
        if (bVar1 != 0) {
          eVar3 = 0;
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t botpHOTPVerify(const char* otp, const octet key[], size_t key_len, 
	const octet ctr[8])
{
	void* state;
	bool_t success;
	// проверить входные данные
	if (!strIsValid(otp) || strLen(otp) < 6 || strLen(otp) > 8)
		return ERR_BAD_PWD;
	if (!memIsValid(key, key_len) || !memIsValid(ctr, 8))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpHOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// проверить пароль
	botpHOTPStart(state, strLen(otp), key, key_len);
	botpHOTPStepS(state, ctr);
	success = botpHOTPStepV(otp, state);
	// завершить
	blobClose(state);
	return success ? ERR_OK : ERR_BAD_PWD;
}